

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_point
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,Vec3f *_point
          )

{
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_00;
  return_type local_40;
  BaseHandle local_24;
  Vec3f *local_20;
  Vec3f *_point_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  VertexHandle _vh_local;
  
  this_00 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
            this->mesh_;
  local_24 = _vh.super_BaseHandle.idx_;
  local_20 = _point;
  _point_local = (Vec3f *)this;
  this_local._4_4_ = _vh.super_BaseHandle.idx_;
  vector_cast<OpenMesh::VectorT<double,3>,OpenMesh::VectorT<float,3>>
            (&local_40,(OpenMesh *)_point,_point);
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_point
            (this_00,(VertexHandle)local_24.idx_,&local_40);
  return;
}

Assistant:

virtual void set_point(VertexHandle _vh, const Vec3f& _point)
  {
    mesh_.set_point(_vh,vector_cast<Point>(_point));
  }